

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O2

size_type __thiscall
std::
_Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
::_M_bucket_index(_Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *this,__node_value_type *__n)

{
  return ((ulong)*(uint *)((long)&(__n->
                                  super__Hash_node_value_base<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_storage._M_storage + 8) << 0x28 ^
         (long)*(int *)((long)&(__n->
                               super__Hash_node_value_base<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>
                               )._M_storage._M_storage + 4) << 0x14 ^
         (long)*(int *)&(__n->
                        super__Hash_node_value_base<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>
                        )._M_storage._M_storage) % this->_M_bucket_count;
}

Assistant:

std::size_t operator()(const IntVect& vec) const noexcept
        {
            AMREX_D_DECL(std::size_t ret0 = vec[0], ret1 = vec[1], ret2 = vec[2]);
#if AMREX_SPACEDIM == 1
            return ret0;
#elif AMREX_SPACEDIM == 2
            return ret0 ^ (ret1 << shift1);
#else
            return ret0 ^ (ret1 << shift1) ^ (ret2 << shift2);
#endif
        }